

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_start(bitstream *str,uint32_t *val)

{
  uint8_t uVar1;
  byte bVar2;
  uint32_t uVar3;
  uint in_EAX;
  int iVar4;
  long lVar5;
  uint8_t *puVar6;
  long lVar7;
  int iVar8;
  char *__ptr;
  uint uVar9;
  size_t sStack_40;
  undefined4 uStack_38;
  int bit;
  
  if ((str->type & ~VS_H263) == VS_H261) {
    uVar9 = (uint)(str->type == VS_H261);
    _uStack_38 = (ulong)in_EAX;
    while( true ) {
      if ((int)(0x10 - uVar9) <= str->zero_bits) {
        do {
          if (bit != 0) {
            iVar4 = vs_u(str,val,uVar9 ^ 5);
            return iVar4;
          }
          _uStack_38 = CONCAT44(1,uStack_38);
          iVar4 = vs_bit(str,(uint32_t *)&bit);
        } while (iVar4 == 0);
        return 1;
      }
      iVar4 = vs_bit(str,(uint32_t *)&bit);
      if (iVar4 != 0) break;
      if (bit != 0) {
        fwrite("Found premature 1 bit when searching for a start code!\n",0x37,1,_stderr);
        return 1;
      }
    }
    return 1;
  }
  if (str->bitpos == 7) {
    if (str->dir == VS_ENCODE) {
      iVar4 = str->bytesnum;
      iVar8 = str->bytesmax;
      if (iVar4 < iVar8) {
        puVar6 = str->bytes;
      }
      else {
        iVar4 = iVar8 * 2;
        if (iVar8 == 0) {
          iVar4 = 0x10;
        }
        str->bytesmax = iVar4;
        puVar6 = (uint8_t *)realloc(str->bytes,(long)iVar4);
        str->bytes = puVar6;
        iVar4 = str->bytesnum;
      }
      str->bytesnum = iVar4 + 1;
      puVar6[iVar4] = '\0';
      iVar4 = str->bytesnum;
      iVar8 = str->bytesmax;
      puVar6 = str->bytes;
      if (iVar8 <= iVar4) {
        iVar4 = iVar8 * 2;
        if (iVar8 == 0) {
          iVar4 = 0x10;
        }
        str->bytesmax = iVar4;
        puVar6 = (uint8_t *)realloc(puVar6,(long)iVar4);
        str->bytes = puVar6;
        iVar4 = str->bytesnum;
      }
      str->bytesnum = iVar4 + 1;
      puVar6[iVar4] = '\0';
      iVar4 = str->bytesnum;
      iVar8 = str->bytesmax;
      puVar6 = str->bytes;
      if (iVar8 <= iVar4) {
        iVar4 = iVar8 * 2;
        if (iVar8 == 0) {
          iVar4 = 0x10;
        }
        str->bytesmax = iVar4;
        puVar6 = (uint8_t *)realloc(puVar6,(long)iVar4);
        str->bytes = puVar6;
        iVar4 = str->bytesnum;
      }
      str->bytesnum = iVar4 + 1;
      puVar6[iVar4] = '\x01';
      iVar4 = str->bytesnum;
      iVar8 = str->bytesmax;
      puVar6 = str->bytes;
      if (iVar8 <= iVar4) {
        iVar4 = iVar8 * 2;
        if (iVar8 == 0) {
          iVar4 = 0x10;
        }
        str->bytesmax = iVar4;
        puVar6 = (uint8_t *)realloc(puVar6,(long)iVar4);
        str->bytes = puVar6;
        iVar4 = str->bytesnum;
      }
      uVar3 = *val;
      str->bytesnum = iVar4 + 1;
      puVar6[iVar4] = (uint8_t)uVar3;
    }
    else {
      lVar7 = (long)str->bytepos;
      lVar5 = lVar7 << 0x20;
      iVar4 = str->zero_bytes;
      do {
        iVar8 = iVar4;
        str->zero_bytes = iVar8;
        if (str->bytesnum <= lVar7) goto LAB_00104021;
        str->bytepos = (int)lVar7 + 1;
        uVar1 = str->bytes[lVar7];
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x100000000;
        str->curbyte = uVar1;
        iVar4 = iVar8 + 1;
      } while (uVar1 == '\0');
      if (uVar1 != '\x01') {
        fprintf(_stderr,"Found byte %08x when searching for a start code!\n");
        goto LAB_0010406c;
      }
      if (iVar8 + -1 < 1) {
        fprintf(_stderr,"Found premature byte %08x when searching for a start code!\n",1);
        return 1;
      }
      if (str->bytesnum <= (int)lVar7) {
LAB_00104021:
        __ptr = "End of bitstream when searching for a start code!\n";
        sStack_40 = 0x32;
        goto LAB_00104049;
      }
      str->bytepos = (int)lVar7 + 1;
      bVar2 = str->bytes[lVar5 >> 0x20];
      str->curbyte = bVar2;
      str->zero_bytes = 0;
      *val = (uint)bVar2;
    }
    iVar4 = 0;
  }
  else {
    __ptr = "Start code attempted at non-bytealigned position\n";
    sStack_40 = 0x31;
LAB_00104049:
    fwrite(__ptr,sStack_40,1,_stderr);
LAB_0010406c:
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int vs_start(struct bitstream *str, uint32_t *val) {
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		int nsbit = (str->type == VS_H261 ? 4 : 5);
		int bit = 0;
		while (str->zero_bits < nzbit) {
			if (vs_bit(str, &bit)) return 1;
			if (bit != 0) {
				fprintf(stderr, "Found premature 1 bit when searching for a start code!\n");
				return 1;
			}
		}
		while (bit == 0) {
			bit = 1;
			if (vs_bit(str, &bit)) return 1;
		}
		if (vs_u(str, val, nsbit)) return 1;
		return 0;
	} else {
		if (str->bitpos != 7) {
			fprintf (stderr, "Start code attempted at non-bytealigned position\n");
			return 1;
		}
		if (str->dir == VS_ENCODE) {
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 1);
			ADDARRAY(str->bytes, *val);
		} else {
			str->zero_bytes--;
			do {
				str->zero_bytes++;
				if (str->bytepos >= str->bytesnum) {
					fprintf(stderr, "End of bitstream when searching for a start code!\n");
					return 1;
				}
				str->curbyte = str->bytes[str->bytepos++];
			} while (str->curbyte == 0);
			if (str->curbyte != 1) {
				fprintf(stderr, "Found byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->zero_bytes < 2) {
				fprintf(stderr, "Found premature byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->bytepos >= str->bytesnum) {
				fprintf(stderr, "End of bitstream when searching for a start code!\n");
				return 1;
			}
			str->curbyte = str->bytes[str->bytepos++];
			str->zero_bytes = 0;
			*val = str->curbyte;
		}
	}
	return 0;
}